

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.c
# Opt level: O0

size_t bell_number(size_t n)

{
  size_t *xs;
  size_t sVar1;
  size_t *partitioning;
  size_t bell_number;
  size_t n_local;
  
  partitioning = (size_t *)0x0;
  xs = inform_first_partitioning(n);
  do {
    partitioning = (size_t *)((long)partitioning + 1);
    sVar1 = inform_next_partitioning(xs,n);
  } while (sVar1 != 0);
  free(xs);
  return (size_t)partitioning;
}

Assistant:

static size_t bell_number(size_t n)
{
    size_t bell_number = 0;
    size_t *partitioning = inform_first_partitioning(n);
    do
    {
        ++bell_number;
    } while (inform_next_partitioning(partitioning, n));
    free(partitioning);
    return bell_number;
}